

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

int * nvpair_get_descriptor_array(nvpair_t *nvp,size_t *nitems)

{
  char *__assertion;
  
  if (nvp == (nvpair_t *)0x0) {
    __assertion = "(nvp) != ((void*)0)";
  }
  else {
    if (nvp->nvp_magic == 0x6e7670) {
      if (nvp->nvp_type == 0xc) {
        if (nitems != (size_t *)0x0) {
          *nitems = nvp->nvp_nitems;
        }
        return (int *)nvp->nvp_data;
      }
      __assert_fail("nvp->nvp_type == 12",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                    ,0x760,"const int *nvpair_get_descriptor_array(const nvpair_t *, size_t *)");
    }
    __assertion = "(nvp)->nvp_magic == 0x6e7670";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x75f,"const int *nvpair_get_descriptor_array(const nvpair_t *, size_t *)");
}

Assistant:

const int *
nvpair_get_descriptor_array(const nvpair_t *nvp, size_t *nitems)
{

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_DESCRIPTOR_ARRAY);

	if (nitems != NULL)
		*nitems = nvp->nvp_nitems;

	return ((const int *)(intptr_t)nvp->nvp_data);
}